

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

void kwsysProcessDestroy(cmsysProcess *cp)

{
  __pid_t _Var1;
  int iVar2;
  int *piVar3;
  char *__src;
  bool bVar4;
  int local_14;
  int result;
  int i;
  cmsysProcess *cp_local;
  
  for (local_14 = 0; local_14 < cp->NumberOfCommands; local_14 = local_14 + 1) {
    if (cp->ForkPIDs[local_14] != 0) {
      do {
        _Var1 = waitpid(cp->ForkPIDs[local_14],cp->CommandExitCodes + local_14,1);
        bVar4 = false;
        if (_Var1 < 0) {
          piVar3 = __errno_location();
          bVar4 = *piVar3 == 4;
        }
      } while (bVar4);
      if (_Var1 < 1) {
        if ((_Var1 < 0) && (cp->State != 1)) {
          piVar3 = __errno_location();
          __src = strerror(*piVar3);
          strncpy(cp->ErrorMessage,__src,0x400);
          cp->State = 1;
        }
      }
      else {
        cp->ForkPIDs[local_14] = 0;
        iVar2 = cp->CommandsLeft + -1;
        cp->CommandsLeft = iVar2;
        if (iVar2 == 0) {
          kwsysProcessCleanupDescriptor(&cp->SignalPipe);
        }
      }
    }
  }
  return;
}

Assistant:

static void kwsysProcessDestroy(kwsysProcess* cp)
{
  /* A child process has terminated.  Reap it if it is one handled by
     this object.  */
  int i;
  for(i=0; i < cp->NumberOfCommands; ++i)
    {
    if(cp->ForkPIDs[i])
      {
      int result;
      while(((result = waitpid(cp->ForkPIDs[i],
                               &cp->CommandExitCodes[i], WNOHANG)) < 0) &&
            (errno == EINTR));
      if(result > 0)
        {
        /* This child has termianted.  */
        cp->ForkPIDs[i] = 0;
        if(--cp->CommandsLeft == 0)
          {
          /* All children have terminated.  Close the signal pipe
             write end so that no more notifications are sent to this
             object.  */
          kwsysProcessCleanupDescriptor(&cp->SignalPipe);

          /* TODO: Once the children have terminated, switch
             WaitForData to use a non-blocking read to get the
             rest of the data from the pipe.  This is needed when
             grandchildren keep the output pipes open.  */
          }
        }
      else if(result < 0 && cp->State != kwsysProcess_State_Error)
        {
        /* Unexpected error.  Report the first time this happens.  */
        strncpy(cp->ErrorMessage, strerror(errno), KWSYSPE_PIPE_BUFFER_SIZE);
        cp->State = kwsysProcess_State_Error;
        }
      }
    }
}